

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  
  basic_suite::run();
  integer_suite::run();
  number_suite::run();
  string_suite::run();
  array_suite::run();
  compact_array_suite::run();
  struct_suite::run();
  split_struct_suite::run();
  dynamic_suite::run();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    basic_suite::run();
    integer_suite::run();
    number_suite::run();
    string_suite::run();
    array_suite::run();
    compact_array_suite::run();
    struct_suite::run();
    split_struct_suite::run();
    dynamic_suite::run();

    return boost::report_errors();
}